

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructAddHandler_Test::TestBody(Engine_testConstructAddHandler_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  pointer expr2;
  void **val1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Engine e;
  unique_ptr<Handler,_std::default_delete<Handler>_> *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  unique_ptr<PrintHandler,_std::default_delete<PrintHandler>_> *in_stack_fffffffffffffe78;
  unique_ptr<Handler,_std::default_delete<Handler>_> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  int iVar3;
  char *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  Type in_stack_fffffffffffffe9c;
  Type type;
  Engine *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_f8 [2];
  size_type local_d8;
  undefined4 local_cc;
  AssertionResult local_c8 [3];
  size_type local_98;
  undefined4 local_8c;
  AssertionResult local_88;
  uint local_74;
  AssertionResult local_50;
  Engine local_40;
  
  Engine::Engine(in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
             (char (*) [4])in_stack_fffffffffffffe78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x116d14);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               (char *)in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
    testing::Message::~Message((Message *)0x116d71);
  }
  local_74 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x116ddf);
  if (local_74 == 0) {
    local_8c = 0;
    pvVar2 = Engine::GetHandlers(&local_40);
    local_98 = std::
               vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               ::size(pvVar2);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
               (int *)in_stack_fffffffffffffe78,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      testing::AssertionResult::failure_message((AssertionResult *)0x116ebc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (char *)in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      testing::Message::~Message((Message *)0x116f19);
    }
    local_74 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x116f87);
    if (local_74 == 0) {
      std::make_unique<PrintHandler>();
      std::unique_ptr<Handler,std::default_delete<Handler>>::
      unique_ptr<PrintHandler,std::default_delete<PrintHandler>,void>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      Engine::RegisterHandler
                ((Engine *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                (in_stack_fffffffffffffe80);
      std::unique_ptr<PrintHandler,_std::default_delete<PrintHandler>_>::~unique_ptr
                ((unique_ptr<PrintHandler,_std::default_delete<PrintHandler>_> *)
                 CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      local_cc = 1;
      pvVar2 = Engine::GetHandlers(&local_40);
      local_d8 = std::
                 vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                 ::size(pvVar2);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                (in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                 (int *)in_stack_fffffffffffffe78,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      iVar3 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c);
      if (!bVar1) {
        testing::Message::Message((Message *)pvVar2);
        in_stack_fffffffffffffe90 =
             testing::AssertionResult::failure_message((AssertionResult *)0x1170e9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)pvVar2,type,in_stack_fffffffffffffe90,iVar3,
                   (char *)in_stack_fffffffffffffe80);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        testing::Message::~Message((Message *)0x117146);
      }
      local_74 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1171b4);
      if (local_74 == 0) {
        this_00 = Engine::GetHandlers(&local_40);
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::operator[](this_00,0);
        expr2 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                          ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                           CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        if (expr2 == (pointer)0x0) {
          val1 = (void **)0x0;
        }
        else {
          val1 = (void **)__dynamic_cast(expr2,&Handler::typeinfo,&PrintHandler::typeinfo,0);
        }
        testing::internal::CmpHelperNE<decltype(nullptr),PrintHandler*>
                  ((char *)this_00,(char *)expr2,val1,
                   (PrintHandler **)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        iVar3 = (int)((ulong)this_00 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
        in_stack_fffffffffffffe77 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)pvVar2);
          testing::AssertionResult::failure_message((AssertionResult *)0x1172d5);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)pvVar2,type,in_stack_fffffffffffffe90,iVar3,(char *)expr2);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
          testing::Message::~Message((Message *)0x117330);
        }
        local_74 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x11739b);
        if (local_74 == 0) {
          local_74 = 0;
        }
      }
    }
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  return;
}

Assistant:

TEST(Engine, testConstructAddHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    e.RegisterHandler(std::move(std::make_unique<PrintHandler>()));
    ASSERT_EQ(1, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<PrintHandler *>(e.GetHandlers()[0].get()));
}